

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_lua_generator.cc
# Opt level: O1

void __thiscall
t_lua_generator::generate_lua_struct_reader(t_lua_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  t_field *tfield;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  char *this_00;
  pointer pptVar4;
  string local_70;
  string local_50;
  
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"function ",9);
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,*(char **)CONCAT44(extraout_var,iVar2),
                      ((undefined8 *)CONCAT44(extraout_var,iVar2))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,":read(iprot)",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar3 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"iprot:readStructBegin()",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar3 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"while true do",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar3 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"local fname, ftype, fid = iprot:readFieldBegin()",0x30);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar3 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"if ftype == TType.STOP then",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar3 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"break",5);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  pptVar4 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar4 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      poVar3 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"elseif fid == ",0xe);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(*pptVar4)->key_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," then",5);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      poVar3 = t_generator::indent((t_generator *)this,out);
      this_00 = "if ftype == ";
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"if ftype == ",0xc);
      type_to_enum_abi_cxx11_(&local_70,(t_lua_generator *)this_00,(*pptVar4)->type_);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_70._M_dataplus._M_p,local_70._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," then",5);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      tfield = *pptVar4;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"self.","");
      generate_deserialize_field(this,out,tfield,false,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      poVar3 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"else",4);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      poVar3 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  iprot:skip(ftype)",0x13);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      poVar3 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"end",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      pptVar4 = pptVar4 + 1;
    } while (pptVar4 !=
             (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar3 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"else",4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar3 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  iprot:skip(ftype)",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar3 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"end",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar3 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"iprot:readFieldEnd()",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar3 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"end",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar3 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"iprot:readStructEnd()",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(out,"end",3);
  return;
}

Assistant:

void t_lua_generator::generate_lua_struct_reader(ostream& out, t_struct* tstruct) {
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  // function
  indent(out) << endl << endl << "function " << tstruct->get_name() << ":read(iprot)" << endl;
  indent_up();

  indent(out) << "iprot:readStructBegin()" << endl;

  // while: Read in fields
  indent(out) << "while true do" << endl;
  indent_up();

  // if: Check what to read
  indent(out) << "local fname, ftype, fid = iprot:readFieldBegin()" << endl;
  indent(out) << "if ftype == TType.STOP then" << endl;
  indent_up();
  indent(out) << "break" << endl;

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    indent_down();
    indent(out) << "elseif fid == " << (*f_iter)->get_key() << " then" << endl;
    indent_up();
    indent(out) << "if ftype == " << type_to_enum((*f_iter)->get_type()) << " then" << endl;
    indent_up();

    // Read field contents
    generate_deserialize_field(out, *f_iter, false, "self.");

    indent_down();
    indent(out) << "else" << endl;
    indent(out) << "  iprot:skip(ftype)" << endl;
    indent(out) << "end" << endl;
  }

  // end if
  indent_down();
  indent(out) << "else" << endl;
  indent(out) << "  iprot:skip(ftype)" << endl;
  indent(out) << "end" << endl;
  indent(out) << "iprot:readFieldEnd()" << endl;

  // end while
  indent_down();
  indent(out) << "end" << endl;
  indent(out) << "iprot:readStructEnd()" << endl;

  // end function
  indent_down();
  indent(out);
  out << "end";
}